

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_ray_sphere_ex
                (rf_ray ray,rf_vec3 center,float radius,rf_vec3 *collision_point)

{
  float fVar1;
  float fVar2;
  float __x;
  rf_vec3 rVar3;
  float local_120;
  float local_cc;
  float fStack_c8;
  rf_vec3 c_point;
  float collision_distance;
  float d;
  float vector;
  float distance;
  rf_vec3 ray_sphere_pos;
  _Bool collision;
  rf_vec3 *collision_point_local;
  float radius_local;
  rf_vec3 center_local;
  
  rVar3 = rf_vec3_sub(center,ray.position);
  fVar1 = rf_vec3_len(rVar3);
  fVar2 = rf_vec3_dot_product(rVar3,ray.direction);
  __x = radius * radius + -(fVar1 * fVar1 + -(fVar2 * fVar2));
  if (radius <= fVar1) {
    fVar1 = sqrtf(__x);
    c_point.y = fVar2 - fVar1;
  }
  else {
    fVar1 = sqrtf(__x);
    c_point.y = fVar2 + fVar1;
  }
  rVar3 = rf_vec3_scale(ray.direction,c_point.y);
  rVar3 = rf_vec3_add(ray.position,rVar3);
  local_120 = rVar3.z;
  local_cc = rVar3.x;
  collision_point->x = local_cc;
  fStack_c8 = rVar3.y;
  collision_point->y = fStack_c8;
  collision_point->z = local_120;
  return 0.0 <= __x;
}

Assistant:

RF_API bool rf_check_collision_ray_sphere_ex(rf_ray ray, rf_vec3 center, float radius, rf_vec3 *collision_point)
{
    bool collision = false;

    rf_vec3 ray_sphere_pos = rf_vec3_sub(center, ray.position);
    float distance = rf_vec3_len(ray_sphere_pos);
    float vector = rf_vec3_dot_product(ray_sphere_pos, ray.direction);
    float d = radius * radius - (distance * distance - vector * vector);

    if (d >= 0.0f) collision = true;

// Check if ray origin is inside the sphere to calculate the correct collision point
    float collision_distance = 0;

    if (distance < radius) collision_distance = vector + sqrtf(d);
    else collision_distance = vector - sqrtf(d);

// Calculate collision point
    rf_vec3 c_point = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, collision_distance));

    collision_point->x = c_point.x;
    collision_point->y = c_point.y;
    collision_point->z = c_point.z;

    return collision;
}